

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_posix.h
# Opt level: O0

char * FormatPackagePath(KonohaContext *kctx,char *buf,size_t bufsiz,char *packageName,char *ext)

{
  kbool_t kVar1;
  char *path_00;
  char *pcVar2;
  undefined8 in_RCX;
  size_t in_RDX;
  char *in_RSI;
  long in_RDI;
  char *in_R8;
  char *local;
  char *path;
  char *in_stack_ffffffffffffff70;
  char *local_80;
  char *local_38;
  long local_30;
  
  local_30 = (**(code **)(*(long *)(in_RDI + 0x10) + 0x48))("KONOHA_HOME");
  local_38 = "/package";
  if (local_30 == 0) {
    local_30 = (**(code **)(*(long *)(in_RDI + 0x10) + 0x48))("HOME");
    local_38 = "/.konoha/package";
  }
  path_00 = ShortPackageName(in_stack_ffffffffffffff70);
  pcVar2 = in_R8;
  snprintf(in_RSI,in_RDX,"%s%s/%s/%s%s",local_30,local_38,in_RCX);
  kVar1 = HasFile(path_00);
  if (!kVar1) {
    pcVar2 = ShortPackageName(pcVar2);
    snprintf(in_RSI,in_RDX,"/usr/local/lib/konoha/3.0/package/%s/%s%s",in_RCX,pcVar2,in_R8);
  }
  kVar1 = HasFile(path_00);
  local_80 = in_RSI;
  if (!kVar1) {
    local_80 = (char *)0x0;
  }
  return local_80;
}

Assistant:

static const char* FormatPackagePath(KonohaContext *kctx, char *buf, size_t bufsiz, const char *packageName, const char *ext)
{
	const char *path = PLATAPI getenv_i("KONOHA_HOME");
	const char *local = "/package";
	if(path == NULL) {
		path = PLATAPI getenv_i("HOME");
		local = "/.konoha/package";
	}
	snprintf(buf, bufsiz, "%s%s/%s/%s%s", path, local, packageName, ShortPackageName(packageName), ext);
#ifdef K_PREFIX
	if(!HasFile(buf)) {
		snprintf(buf, bufsiz, K_PREFIX "/lib/konoha/" K_VERSION "/package" "/%s/%s%s", packageName, ShortPackageName(packageName), ext);
	}
#endif
	return HasFile(buf) ? (const char *)buf : NULL;
}